

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall Application::run(Application *this)

{
  char cVar1;
  Application *this_00;
  
  this_00 = this;
  do {
    cVar1 = queryAction(this_00);
    switch(cVar1) {
    case '1':
      this_00 = this;
      queryEnterOrder(this);
      break;
    case '2':
      this_00 = this;
      queryCancelOrder(this);
      break;
    case '3':
      this_00 = this;
      queryReplaceOrder(this);
      break;
    case '4':
      this_00 = this;
      queryMarketDataRequest(this);
      break;
    case '5':
      return;
    }
  } while( true );
}

Assistant:

void Application::run() {
  while (true) {
    try {
      char action = queryAction();

      if (action == '1') {
        queryEnterOrder();
      } else if (action == '2') {
        queryCancelOrder();
      } else if (action == '3') {
        queryReplaceOrder();
      } else if (action == '4') {
        queryMarketDataRequest();
      } else if (action == '5') {
        break;
      }
    } catch (std::exception &e) {
      std::cout << "Message Not Sent: " << e.what();
    }
  }
}